

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSampleConsensusProblem.hpp
# Opt level: O1

void __thiscall
opengv::sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::setUniformIndices
          (MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,
          vector<int,_std::allocator<int>_> *N)

{
  shared_ptr<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  long lVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__p;
  pointer piVar2;
  long lVar3;
  ulong uVar4;
  
  this_00 = &this->indices_;
  __p = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *)operator_new(0x18);
  (__p->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __shared_ptr<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  reset<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            ((__shared_ptr<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,(__gnu_cxx::_Lock_policy)2>
              *)this_00,__p);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((this->indices_).
           super___shared_ptr<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr,(long)(N->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(N->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  piVar2 = (N->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((N->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar2) {
    uVar4 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 (uVar4 * 0x18 +
                 (long)(((this_00->
                         super___shared_ptr<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start),(long)piVar2[uVar4]);
      piVar2 = (N->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      if (0 < piVar2[uVar4]) {
        lVar1 = *(long *)((long)(((this_00->
                                  super___shared_ptr<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar4 * 0x18);
        lVar3 = 0;
        do {
          *(int *)(lVar1 + lVar3 * 4) = (int)lVar3;
          lVar3 = lVar3 + 1;
        } while (lVar3 < piVar2[uVar4]);
      }
      uVar4 = uVar4 + 1;
      piVar2 = (N->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar4 < (ulong)((long)(N->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&this->shuffled_indices_,
              (this->indices_).
              super___shared_ptr<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr);
  return;
}

Assistant:

void
opengv::sac::MultiSampleConsensusProblem<M>::setUniformIndices(
    std::vector<int> N)
{
  indices_.reset( new std::vector< std::vector<int> >() );
  indices_->resize(N.size());
  for( size_t j = 0; j < N.size(); j++ )
  {
    (*indices_)[j].resize(N[j]);
    for( int i = 0; i < N[j]; ++i )
      (*indices_)[j][i] = i;
  }
  shuffled_indices_ = *indices_;
}